

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

type * linalg::detail::
       apply<linalg::detail::op_mul,void,linalg::vec<double,4>,linalg::vec<double,4>>::impl<0,1,2,3>
                 (type *param_1,double *param_2,double *param_3)

{
  double dVar1;
  double dVar2;
  
  dVar1 = param_2[1];
  dVar2 = param_3[1];
  param_1->x = *param_3 * *param_2;
  param_1->y = dVar2 * dVar1;
  dVar1 = param_2[3];
  dVar2 = param_3[3];
  param_1->z = param_3[2] * param_2[2];
  param_1->w = dVar2 * dVar1;
  return param_1;
}

Assistant:

static constexpr type impl(seq<I...>, F f, const vec<A,M> & a, const vec<B,M> & b                    ) { return {f(getter<I>{}(a), getter<I>{}(b)                )...}; }